

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkFenceType>::Release
          (RecycledSyncObject<VulkanUtilities::VkFenceType> *this)

{
  VulkanSyncObjectManager *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  this_00 = (this->m_pManager).
            super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00 != (VulkanSyncObjectManager *)0x0) && (this->m_VkSyncObject != (VkFence)0x0)) {
    Recycle(this_00,this->m_VkSyncObject,this->m_IsUnsignaled);
    (this->m_pManager).
    super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    this_01 = (this->m_pManager).
              super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->m_pManager).
    super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->m_VkSyncObject = (NativeType)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      return;
    }
  }
  return;
}

Assistant:

void Release()
    {
        if (m_pManager && m_VkSyncObject != VK_NULL_HANDLE)
        {
            m_pManager->Recycle(VkSyncObjType{m_VkSyncObject}, m_IsUnsignaled);
            m_VkSyncObject = VK_NULL_HANDLE;
            m_pManager.reset();
        }
    }